

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O2

void FastPForLib::Simple8b<true>::carefulunpack<4u>(uint32_t num1,uint32_t **out,uint64_t **in)

{
  uint32_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar3 = 0x38; (ulong)num1 * 4 + uVar3 != 0x38; uVar3 = uVar3 - 4) {
    puVar1 = *out;
    uVar2 = **in;
    *out = puVar1 + 1;
    *puVar1 = (uint)(uVar2 >> (uVar3 & 0x3f)) & 0xf;
  }
  *in = *in + 1;
  return;
}

Assistant:

static void carefulunpack(uint32_t num1, uint32_t *&out,
                            const uint64_t *&in) {
    if (log1 < 32) {
      const uint32_t actuallog1 =
          log1 < 32 ? log1 : 31; // bogus to silence compiler warnings
      const uint32_t mask = ((static_cast<uint32_t>(1) << actuallog1) - 1);
      for (uint32_t k = 0; k < num1; ++k) {
        *(out++) = static_cast<uint32_t>(
                       in[0] >> (64 - SIMPLE8B_LOGDESC - log1 - k * log1)) &
                   mask;
      }
    } else {
      for (uint32_t k = 0; k < num1; ++k) {
        *(out++) = static_cast<uint32_t>(
            in[0] >> (64 - SIMPLE8B_LOGDESC - log1 - k * log1));
      }
    }
    ++in;
  }